

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O2

bool __thiscall basisu::basisu_frontend::init_global_codebooks(basisu_frontend *this)

{
  endpoint_vec *this_00;
  selector_vec *this_01;
  vector<basisu::etc_block> *this_02;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  job_pool *this_03;
  vector<basisu::vector<unsigned_int>_> *pvVar4;
  vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *pvVar5;
  uint32_t val;
  endpoint *peVar6;
  endpoint_cluster_etc_params *peVar7;
  etc_block *peVar8;
  selector *this_04;
  vec2U *pvVar9;
  vector<unsigned_int> *pvVar10;
  uint *puVar11;
  etc_block *peVar12;
  uint32_t first_index;
  uint uVar13;
  uint32_t y;
  uint32_t y_00;
  uint32_t i;
  int iVar14;
  ulong uVar15;
  uint32_t i_1;
  uint32_t x;
  uint32_t x_00;
  uint uVar16;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  basisu_lowlevel_etc1s_transcoder *local_68;
  vector<unsigned_int> *local_60;
  vector<basisu::etc_block> *local_58;
  vector<basisu::vector<unsigned_int>_> *local_50;
  vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *local_48;
  ulong local_40;
  vector<basisu::vec2U> *local_38;
  
  local_68 = (this->m_params).m_pGlobal_codebooks;
  this_00 = &local_68->m_local_endpoints;
  local_48 = &this->m_endpoint_cluster_etc_params;
  vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::resize
            (local_48,(ulong)(local_68->m_local_endpoints).m_size,false);
  pvVar5 = local_48;
  for (uVar15 = 0; uVar15 < (local_68->m_local_endpoints).m_size; uVar15 = uVar15 + 1) {
    peVar6 = vector<basist::endpoint>::operator[](this_00,uVar15);
    bVar1 = peVar6->m_inten5;
    peVar7 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[](pvVar5,uVar15)
    ;
    peVar7->m_inten_table[0] = (uint)bVar1;
    peVar6 = vector<basist::endpoint>::operator[](this_00,uVar15);
    bVar1 = peVar6->m_inten5;
    peVar7 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[](pvVar5,uVar15)
    ;
    peVar7->m_inten_table[1] = (uint)bVar1;
    peVar7 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[](pvVar5,uVar15)
    ;
    peVar6 = vector<basist::endpoint>::operator[](this_00,uVar15);
    bVar1 = (peVar6->m_color5).field_0.field_0.r;
    peVar6 = vector<basist::endpoint>::operator[](this_00,uVar15);
    bVar2 = (peVar6->m_color5).field_0.field_0.g;
    peVar6 = vector<basist::endpoint>::operator[](this_00,uVar15);
    color_rgba::set(peVar7->m_color_unscaled,(uint)bVar1,(uint)bVar2,
                    (uint)(peVar6->m_color5).field_0.field_0.b,0xff);
    peVar7 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[](pvVar5,uVar15)
    ;
    peVar7->m_color_used[0] = true;
    peVar7 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[](pvVar5,uVar15)
    ;
    peVar7->m_valid = true;
  }
  this_01 = &local_68->m_local_selectors;
  this_02 = &this->m_optimized_cluster_selectors;
  vector<basisu::etc_block>::resize(this_02,(ulong)(local_68->m_local_selectors).m_size,false);
  for (uVar15 = 0; uVar15 < (this->m_optimized_cluster_selectors).m_size; uVar15 = uVar15 + 1) {
    for (y_00 = 0; y_00 != 4; y_00 = y_00 + 1) {
      for (x_00 = 0; x_00 != 4; x_00 = x_00 + 1) {
        peVar8 = vector<basisu::etc_block>::operator[](this_02,uVar15);
        this_04 = vector<basist::selector>::operator[](this_01,uVar15);
        val = basist::selector::get_selector(this_04,x_00,y_00);
        etc_block::set_selector(peVar8,x_00,y_00,val);
      }
    }
  }
  local_38 = &this->m_block_endpoint_clusters_indices;
  vector<basisu::vec2U>::resize(local_38,(ulong)this->m_total_blocks,false);
  vector<basisu::etc_block>::resize(&this->m_orig_encoded_blocks,(ulong)this->m_total_blocks,false);
  local_60 = &this->m_block_selector_cluster_index;
  vector<unsigned_int>::resize(local_60,(ulong)this->m_total_blocks,false);
  local_50 = &this->m_endpoint_clusters;
  local_58 = &this->m_encoded_blocks;
  uVar15 = 0;
  while ((int)uVar15 != 3) {
    local_40 = uVar15;
    debug_printf("init_global_codebooks: pass %u\n");
    uVar13 = 0;
    while (uVar3 = this->m_total_blocks, uVar13 < uVar3) {
      this_03 = (this->m_params).m_pJob_pool;
      local_78 = (code *)0x0;
      pcStack_70 = (code *)0x0;
      local_88._M_unused._M_object = (void *)0x0;
      local_88._8_8_ = 0;
      local_88._M_unused._M_object = operator_new(0x18);
      uVar16 = uVar13 + 0x80;
      if (uVar16 <= uVar3) {
        uVar3 = uVar16;
      }
      *(basisu_frontend **)&((basisu_frontend *)local_88._M_unused._0_8_)->m_params = this;
      *(uint *)&(((basisu_frontend *)local_88._M_unused._0_8_)->m_params).m_pSource_blocks = uVar13;
      *(uint *)((long)&(((basisu_frontend *)local_88._M_unused._0_8_)->m_params).m_pSource_blocks +
               4) = uVar3;
      (((basisu_frontend *)local_88._M_unused._0_8_)->m_params).m_max_endpoint_clusters =
           (uint32_t)local_40;
      pcStack_70 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:429:35)>
                   ::_M_invoke;
      local_78 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:429:35)>
                 ::_M_manager;
      job_pool::add_job(this_03,(function<void_()> *)&local_88);
      std::_Function_base::~_Function_base((_Function_base *)&local_88);
      uVar13 = uVar16;
    }
    job_pool::wait_for_all((this->m_params).m_pJob_pool);
    pvVar4 = local_50;
    vector<basisu::vector<unsigned_int>_>::resize(local_50,0,false);
    vector<basisu::vector<unsigned_int>_>::resize
              (pvVar4,(ulong)(local_68->m_local_endpoints).m_size,false);
    iVar14 = 1;
    for (uVar15 = 0; uVar15 < this->m_total_blocks; uVar15 = uVar15 + 1) {
      pvVar9 = vector<basisu::vec2U>::operator[](local_38,uVar15);
      pvVar4 = local_50;
      uVar13 = pvVar9->m_comps[0];
      pvVar10 = vector<basisu::vector<unsigned_int>_>::operator[](local_50,(ulong)uVar13);
      local_88._0_4_ = iVar14 + -1;
      vector<unsigned_int>::push_back(pvVar10,(uint *)local_88._M_pod_data);
      pvVar10 = vector<basisu::vector<unsigned_int>_>::operator[](pvVar4,(ulong)uVar13);
      local_88._0_4_ = iVar14;
      vector<unsigned_int>::push_back(pvVar10,(uint *)local_88._M_pod_data);
      iVar14 = iVar14 + 2;
    }
    vector<unsigned_int>::resize(local_60,(ulong)this->m_total_blocks,false);
    uVar13 = 0;
    while (uVar3 = this->m_total_blocks, uVar13 < uVar3) {
      uVar16 = uVar13 + 0x80;
      if (uVar16 <= uVar3) {
        uVar3 = uVar16;
      }
      local_88._12_4_ = uVar3;
      local_88._8_4_ = uVar13;
      pcStack_70 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:505:35)>
                   ::_M_invoke;
      local_78 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:505:35)>
                 ::_M_manager;
      local_88._M_unused._M_object = this;
      job_pool::add_job((this->m_params).m_pJob_pool,(function<void_()> *)&local_88);
      std::_Function_base::~_Function_base((_Function_base *)&local_88);
      uVar13 = uVar16;
    }
    job_pool::wait_for_all((this->m_params).m_pJob_pool);
    vector<basisu::etc_block>::resize(local_58,(ulong)this->m_total_blocks,false);
    for (uVar15 = 0; uVar15 < this->m_total_blocks; uVar15 = uVar15 + 1) {
      pvVar9 = vector<basisu::vec2U>::operator[](local_38,uVar15);
      uVar13 = pvVar9->m_comps[0];
      puVar11 = vector<unsigned_int>::operator[](local_60,uVar15);
      uVar3 = *puVar11;
      peVar8 = vector<basisu::etc_block>::operator[](local_58,uVar15);
      pvVar5 = local_48;
      peVar7 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                         (local_48,(ulong)uVar13);
      etc_block::set_block_color5_etc1s(peVar8,peVar7->m_color_unscaled);
      peVar7 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                         (pvVar5,(ulong)uVar13);
      etc_block::set_inten_tables_etc1s(peVar8,peVar7->m_inten_table[0]);
      (peVar8->field_0).m_bytes[3] = (peVar8->field_0).m_bytes[3] | 1;
      peVar12 = vector<basisu::etc_block>::operator[](this_02,(ulong)uVar3);
      *(undefined4 *)((long)&peVar8->field_0 + 4) = *(undefined4 *)((long)&peVar12->field_0 + 4);
    }
    uVar15 = (ulong)((int)local_40 + 1);
  }
  vector<basisu::vector<unsigned_int>_>::resize
            (&this->m_selector_cluster_block_indices,(ulong)(local_68->m_local_selectors).m_size,
             false);
  uVar13 = 0;
  while (local_88._0_4_ = uVar13, uVar13 < (this->m_etc1_blocks_etc1s).m_size) {
    puVar11 = vector<unsigned_int>::operator[](local_60,(ulong)uVar13);
    pvVar10 = vector<basisu::vector<unsigned_int>_>::operator[]
                        (&this->m_selector_cluster_block_indices,(ulong)*puVar11);
    vector<unsigned_int>::push_back(pvVar10,(uint *)local_88._M_pod_data);
    uVar13 = local_88._0_4_ + 1;
  }
  return true;
}

Assistant:

bool basisu_frontend::init_global_codebooks()
	{
		const basist::basisu_lowlevel_etc1s_transcoder* pTranscoder = m_params.m_pGlobal_codebooks;

		const basist::basisu_lowlevel_etc1s_transcoder::endpoint_vec& endpoints = pTranscoder->get_endpoints();
		const basist::basisu_lowlevel_etc1s_transcoder::selector_vec& selectors = pTranscoder->get_selectors();
				
		m_endpoint_cluster_etc_params.resize(endpoints.size());
		for (uint32_t i = 0; i < endpoints.size(); i++)
		{
			m_endpoint_cluster_etc_params[i].m_inten_table[0] = endpoints[i].m_inten5;
			m_endpoint_cluster_etc_params[i].m_inten_table[1] = endpoints[i].m_inten5;

			m_endpoint_cluster_etc_params[i].m_color_unscaled[0].set(endpoints[i].m_color5.r, endpoints[i].m_color5.g, endpoints[i].m_color5.b, 255);
			m_endpoint_cluster_etc_params[i].m_color_used[0] = true;
			m_endpoint_cluster_etc_params[i].m_valid = true;
		}

		m_optimized_cluster_selectors.resize(selectors.size());
		for (uint32_t i = 0; i < m_optimized_cluster_selectors.size(); i++)
		{
			for (uint32_t y = 0; y < 4; y++)
				for (uint32_t x = 0; x < 4; x++)
					m_optimized_cluster_selectors[i].set_selector(x, y, selectors[i].get_selector(x, y));
		}

		m_block_endpoint_clusters_indices.resize(m_total_blocks);

		m_orig_encoded_blocks.resize(m_total_blocks);

		m_block_selector_cluster_index.resize(m_total_blocks);

#if 0
		for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
		{
			const uint32_t first_index = block_index_iter;
			const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->add_job([this, first_index, last_index] {
#endif

				for (uint32_t block_index = first_index; block_index < last_index; block_index++)
				{
					const etc_block& blk = m_etc1_blocks_etc1s[block_index];

					const uint32_t block_endpoint_index = m_block_endpoint_clusters_indices[block_index][0];

					etc_block trial_blk;
					trial_blk.set_block_color5_etc1s(blk.m_color_unscaled[0]);
					trial_blk.set_flip_bit(true);

					uint64_t best_err = UINT64_MAX;
					uint32_t best_index = 0;

					for (uint32_t i = 0; i < m_optimized_cluster_selectors.size(); i++)
					{
						trial_blk.set_raw_selector_bits(m_optimized_cluster_selectors[i].get_raw_selector_bits());

						const uint64_t cur_err = trial_blk.evaluate_etc1_error(get_source_pixel_block(block_index).get_ptr(), m_params.m_perceptual);
						if (cur_err < best_err)
						{
							best_err = cur_err;
							best_index = i;
							if (!cur_err)
								break;
						}

					} // block_index

					m_block_selector_cluster_index[block_index] = best_index;
				}

#ifndef __EMSCRIPTEN__
				});
#endif

		}

#ifndef __EMSCRIPTEN__
		m_params.m_pJob_pool->wait_for_all();
#endif

		m_encoded_blocks.resize(m_total_blocks);
		for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
		{
			const uint32_t endpoint_index = m_block_endpoint_clusters_indices[block_index][0];
			const uint32_t selector_index = m_block_selector_cluster_index[block_index];

			etc_block& blk = m_encoded_blocks[block_index];

			blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_color_unscaled[0]);
			blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_inten_table[0]);
			blk.set_flip_bit(true);
			blk.set_raw_selector_bits(m_optimized_cluster_selectors[selector_index].get_raw_selector_bits());
		}
#endif

		// HACK HACK
		const uint32_t NUM_PASSES = 3;
		for (uint32_t pass = 0; pass < NUM_PASSES; pass++)
		{
			debug_printf("init_global_codebooks: pass %u\n", pass);

			const uint32_t N = 128;
			for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
			{
				const uint32_t first_index = block_index_iter;
				const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
				m_params.m_pJob_pool->add_job([this, first_index, last_index, pass] {
#endif
										
					for (uint32_t block_index = first_index; block_index < last_index; block_index++)
					{
						const etc_block& blk = pass ? m_encoded_blocks[block_index] : m_etc1_blocks_etc1s[block_index];
						const uint32_t blk_raw_selector_bits = blk.get_raw_selector_bits();

						etc_block trial_blk(blk);
						trial_blk.set_raw_selector_bits(blk_raw_selector_bits);
						trial_blk.set_flip_bit(true);

						uint64_t best_err = UINT64_MAX;
						uint32_t best_index = 0;
						etc_block best_block(trial_blk);
												
						for (uint32_t i = 0; i < m_endpoint_cluster_etc_params.size(); i++)
						{
							if (m_endpoint_cluster_etc_params[i].m_inten_table[0] > blk.get_inten_table(0))
								continue;

							trial_blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[i].m_color_unscaled[0]);
							trial_blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[i].m_inten_table[0]);

							const color_rgba* pSource_pixels = get_source_pixel_block(block_index).get_ptr();
							uint64_t cur_err;
							if (!pass)
								cur_err = trial_blk.determine_selectors(pSource_pixels, m_params.m_perceptual);
							else
								cur_err = trial_blk.evaluate_etc1_error(pSource_pixels, m_params.m_perceptual);

							if (cur_err < best_err)
							{
								best_err = cur_err;
								best_index = i;
								best_block = trial_blk;

								if (!cur_err)
									break;
							}
						}

						m_block_endpoint_clusters_indices[block_index][0] = best_index;
						m_block_endpoint_clusters_indices[block_index][1] = best_index;

						m_orig_encoded_blocks[block_index] = best_block;

					} // block_index

#ifndef __EMSCRIPTEN__
					});
#endif

			}

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->wait_for_all();
#endif

			m_endpoint_clusters.resize(0);
			m_endpoint_clusters.resize(endpoints.size());
			for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
			{
				const uint32_t endpoint_cluster_index = m_block_endpoint_clusters_indices[block_index][0];
				m_endpoint_clusters[endpoint_cluster_index].push_back(block_index * 2);
				m_endpoint_clusters[endpoint_cluster_index].push_back(block_index * 2 + 1);
			}

			m_block_selector_cluster_index.resize(m_total_blocks);

			for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
			{
				const uint32_t first_index = block_index_iter;
				const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
				m_params.m_pJob_pool->add_job([this, first_index, last_index] {
#endif

					for (uint32_t block_index = first_index; block_index < last_index; block_index++)
					{
						const uint32_t block_endpoint_index = m_block_endpoint_clusters_indices[block_index][0];

						etc_block trial_blk;
						trial_blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[block_endpoint_index].m_color_unscaled[0]);
						trial_blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[block_endpoint_index].m_inten_table[0]);
						trial_blk.set_flip_bit(true);

						uint64_t best_err = UINT64_MAX;
						uint32_t best_index = 0;

						for (uint32_t i = 0; i < m_optimized_cluster_selectors.size(); i++)
						{
							trial_blk.set_raw_selector_bits(m_optimized_cluster_selectors[i].get_raw_selector_bits());

							const uint64_t cur_err = trial_blk.evaluate_etc1_error(get_source_pixel_block(block_index).get_ptr(), m_params.m_perceptual);
							if (cur_err < best_err)
							{
								best_err = cur_err;
								best_index = i;
								if (!cur_err)
									break;
							}

						} // block_index

						m_block_selector_cluster_index[block_index] = best_index;
					}

#ifndef __EMSCRIPTEN__
					});
#endif

			}

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->wait_for_all();
#endif

			m_encoded_blocks.resize(m_total_blocks);
			for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
			{
				const uint32_t endpoint_index = m_block_endpoint_clusters_indices[block_index][0];
				const uint32_t selector_index = m_block_selector_cluster_index[block_index];

				etc_block& blk = m_encoded_blocks[block_index];

				blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_color_unscaled[0]);
				blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_inten_table[0]);
				blk.set_flip_bit(true);
				blk.set_raw_selector_bits(m_optimized_cluster_selectors[selector_index].get_raw_selector_bits());
			}

		} // pass

		m_selector_cluster_block_indices.resize(selectors.size());
		for (uint32_t block_index = 0; block_index < m_etc1_blocks_etc1s.size(); block_index++)
			m_selector_cluster_block_indices[m_block_selector_cluster_index[block_index]].push_back(block_index);
				
		return true;
	}